

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O0

int8_t apx_allocator_startThread(apx_allocator_t *self)

{
  int iVar1;
  int *piVar2;
  int rc;
  apx_allocator_t *self_local;
  
  if (self == (apx_allocator_t *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    self_local._7_1_ = -1;
  }
  else {
    self->isRunning = true;
    self->workerThreadValid = true;
    iVar1 = pthread_create(&self->workerThread,(pthread_attr_t *)0x0,threadTask,self);
    if (iVar1 == 0) {
      self_local._7_1_ = '\0';
    }
    else {
      self->workerThreadValid = false;
      self_local._7_1_ = -1;
    }
  }
  return self_local._7_1_;
}

Assistant:

static int8_t apx_allocator_startThread(apx_allocator_t *self)
{
   if( self != 0){
   self->isRunning = true;
   self->workerThreadValid = true;
#ifdef _WIN32
      THREAD_CREATE(self->workerThread,threadTask,self,self->threadId);
      if(self->workerThread == INVALID_HANDLE_VALUE){
         self->workerThreadValid = false;
         return -1;
      }
#else
      int rc = THREAD_CREATE(self->workerThread,threadTask,self);
      if(rc != 0){
         self->workerThreadValid = false;
         return -1;
      }
#endif
      //from this point forward all access to self must be protected by spin lock
      return 0;
   }
   errno = EINVAL;
   return -1;
}